

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O2

VM * vm_new(void)

{
  Package *pPVar1;
  Function *pFVar2;
  Value *pVVar3;
  VM *in_RDI;
  
  in_RDI->pkgs_count = 0;
  in_RDI->pkgs_capacity = 4;
  pPVar1 = (Package *)malloc(0x40);
  in_RDI->pkgs = pPVar1;
  in_RDI->fns_count = 0;
  in_RDI->fns_capacity = 0x10;
  pFVar2 = (Function *)malloc(0x180);
  in_RDI->fns = pFVar2;
  in_RDI->consts_count = 0;
  in_RDI->consts_capacity = 0x10;
  pVVar3 = (Value *)malloc(0x80);
  in_RDI->consts = pVVar3;
  in_RDI->stack_size = 0x400;
  pVVar3 = (Value *)malloc(0x2000);
  in_RDI->stack = pVVar3;
  return in_RDI;
}

Assistant:

VM vm_new() {
	VM vm;
	vm.pkgs_capacity = 4;
	vm.pkgs_count = 0;
	vm.pkgs = malloc(sizeof(Package) * vm.pkgs_capacity);

	vm.fns_capacity = 16;
	vm.fns_count = 0;
	vm.fns = malloc(sizeof(Function) * vm.fns_capacity);

	vm.consts_capacity = 16;
	vm.consts_count = 0;
	vm.consts = malloc(sizeof(Value) * vm.consts_capacity);

	vm.stack_size = 1024;
	vm.stack = malloc(sizeof(Value) * vm.stack_size);
	return vm;
}